

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

void secp256k1_fe_cmov(secp256k1_fe *r,secp256k1_fe *a,int flag)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  ulong uVar4;
  secp256k1_modinv64_signed62 *psVar5;
  int64_t iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  secp256k1_modinv64_modinfo *psVar13;
  secp256k1_modinv64_signed62 *psVar14;
  long lVar15;
  long lVar16;
  secp256k1_modinv64_modinfo *extraout_RDX;
  secp256k1_modinv64_modinfo *extraout_RDX_00;
  secp256k1_modinv64_modinfo *extraout_RDX_01;
  ulong *extraout_RDX_02;
  secp256k1_modinv64_signed62 *a_00;
  secp256k1_fe *a_01;
  uint uVar17;
  secp256k1_modinv64_modinfo *psVar18;
  int iVar19;
  int alen;
  ulong uVar20;
  secp256k1_modinv64_signed62 *a_02;
  secp256k1_modinv64_signed62 *psVar21;
  secp256k1_modinv64_signed62 *psVar22;
  secp256k1_modinv64_signed62 *psVar23;
  secp256k1_modinv64_signed62 *psVar24;
  int64_t *piVar25;
  int64_t *piVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  secp256k1_modinv64_modinfo *psVar30;
  ulong uVar31;
  secp256k1_modinv64_signed62 *psVar32;
  ulong uVar33;
  secp256k1_modinv64_signed62 *psVar34;
  bool bVar35;
  int vflag;
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  secp256k1_modinv64_signed62 sStack_398;
  secp256k1_modinv64_signed62 sStack_370;
  secp256k1_modinv64_signed62 *psStack_348;
  secp256k1_modinv64_signed62 *psStack_340;
  secp256k1_modinv64_signed62 *psStack_338;
  ulong uStack_328;
  secp256k1_modinv64_signed62 *psStack_320;
  ulong uStack_318;
  secp256k1_modinv64_signed62 *psStack_310;
  secp256k1_modinv64_signed62 *psStack_308;
  secp256k1_modinv64_signed62 *psStack_300;
  secp256k1_modinv64_signed62 *psStack_2f8;
  int64_t iStack_2f0;
  secp256k1_modinv64_signed62 *psStack_2e8;
  secp256k1_modinv64_signed62 *psStack_2e0;
  secp256k1_modinv64_signed62 *psStack_2d8;
  secp256k1_modinv64_signed62 *psStack_2d0;
  int64_t iStack_2c8;
  secp256k1_modinv64_signed62 *psStack_2c0;
  int64_t iStack_2b8;
  int64_t iStack_2b0;
  secp256k1_fe *psStack_2a8;
  secp256k1_modinv64_modinfo *psStack_2a0;
  secp256k1_modinv64_signed62 *psStack_298;
  ulong uStack_290;
  secp256k1_modinv64_signed62 *psStack_288;
  secp256k1_modinv64_modinfo *psStack_280;
  code *pcStack_278;
  ulong uStack_268;
  secp256k1_modinv64_signed62 *psStack_260;
  secp256k1_modinv64_signed62 *psStack_258;
  secp256k1_modinv64_signed62 *psStack_250;
  secp256k1_modinv64_signed62 *psStack_248;
  secp256k1_modinv64_signed62 *psStack_240;
  secp256k1_modinv64_signed62 *psStack_238;
  secp256k1_modinv64_modinfo *psStack_230;
  secp256k1_modinv64_signed62 *psStack_228;
  secp256k1_modinv64_signed62 sStack_220;
  long lStack_1f0;
  secp256k1_fe *psStack_1e8;
  ulong uStack_1e0;
  ulong uStack_1d8;
  secp256k1_fe *psStack_1d0;
  ulong uStack_1c8;
  ulong uStack_1c0;
  secp256k1_modinv64_modinfo *psStack_1b8;
  ulong uStack_1b0;
  secp256k1_modinv64_signed62 *psStack_1a8;
  secp256k1_modinv64_signed62 sStack_1a0;
  secp256k1_modinv64_signed62 sStack_170;
  secp256k1_modinv64_trans2x2 sStack_140;
  secp256k1_modinv64_signed62 sStack_120;
  secp256k1_modinv64_signed62 sStack_f0;
  secp256k1_fe sStack_c0;
  
  if ((uint)flag < 2) {
    secp256k1_fe_verify(a);
    secp256k1_fe_verify(r);
    uVar8 = (long)flag - 1;
    uVar4 = -(long)flag;
    r->n[0] = a->n[0] & uVar4 | r->n[0] & uVar8;
    r->n[1] = a->n[1] & uVar4 | r->n[1] & uVar8;
    r->n[2] = a->n[2] & uVar4 | r->n[2] & uVar8;
    r->n[3] = a->n[3] & uVar4 | r->n[3] & uVar8;
    r->n[4] = uVar4 & a->n[4] | uVar8 & r->n[4];
    if (r->magnitude < a->magnitude) {
      r->magnitude = a->magnitude;
    }
    if (a->normalized == 0) {
      r->normalized = 0;
    }
    secp256k1_fe_verify(r);
    return;
  }
  secp256k1_fe_cmov_cold_1();
  psVar13 = (secp256k1_modinv64_modinfo *)0x0;
  pcStack_278 = (code *)0x11ad63;
  psStack_1d0 = r;
  secp256k1_fe_verify(a);
  lStack_1f0 = 0x1000003d1;
  uVar8 = (a->n[4] >> 0x30) * 0x1000003d1 + a->n[0];
  uVar20 = (uVar8 >> 0x34) + a->n[1];
  uVar4 = (uVar20 >> 0x34) + a->n[2];
  uVar11 = (uVar4 >> 0x34) + a->n[3];
  uVar12 = (uVar11 >> 0x34) + (a->n[4] & 0xffffffffffff);
  uStack_1d8 = (uVar20 | uVar8 | uVar4 | uVar11) & 0xfffffffffffff | uVar12;
  uStack_1e0 = (uVar8 ^ 0x1000003d0) & uVar20 & uVar4 & uVar11 & (uVar12 ^ 0xf000000000000);
  pcStack_278 = (code *)0x11ade6;
  secp256k1_fe_verify(a);
  sStack_c0.n[0] = a->n[0];
  sStack_c0.n[1] = a->n[1];
  sStack_c0.n[2] = a->n[2];
  sStack_c0.n[3] = a->n[3];
  sStack_c0.n[4] = a->n[4];
  sStack_c0.magnitude = a->magnitude;
  sStack_c0.normalized = a->normalized;
  pcStack_278 = (code *)0x11ae18;
  psStack_1e8 = a;
  secp256k1_fe_normalize(&sStack_c0);
  sStack_1a0.v[0] = (sStack_c0.n[1] << 0x34 | sStack_c0.n[0]) & 0x3fffffffffffffff;
  a_02 = (secp256k1_modinv64_signed62 *)
         ((ulong)((uint)sStack_c0.n[2] & 0xfffff) << 0x2a | sStack_c0.n[1] >> 10);
  uStack_268 = (ulong)((uint)sStack_c0.n[3] & 0x3fffffff) << 0x20 | sStack_c0.n[2] >> 0x14;
  psStack_228 = (secp256k1_modinv64_signed62 *)
                ((sStack_c0.n[4] & 0xffffffffff) << 0x16 | sStack_c0.n[3] >> 0x1e);
  uVar8 = sStack_c0.n[4] >> 0x28;
  sStack_120.v[4] = 0;
  sStack_120.v[2] = 0;
  sStack_120.v[3] = 0;
  sStack_120.v[0] = 0;
  sStack_120.v[1] = 0;
  sStack_f0.v[1] = 0;
  sStack_f0.v[4] = 0;
  sStack_f0.v[2] = 0;
  sStack_f0.v[3] = 0;
  sStack_f0.v[0] = 1;
  psVar24 = &sStack_220;
  sStack_220.v[2] = 0;
  sStack_220.v[3] = 0;
  sStack_220.v[0] = -0x1000003d1;
  sStack_220.v[1] = 0;
  sStack_220.v[4] = 0x100;
  psStack_238 = (secp256k1_modinv64_signed62 *)0;
  psStack_248 = (secp256k1_modinv64_signed62 *)0;
  psStack_250 = (secp256k1_modinv64_signed62 *)0;
  psStack_230 = (secp256k1_modinv64_modinfo *)0x100;
  a_01 = (secp256k1_fe *)0xffffffffffffffff;
  psVar23 = (secp256k1_modinv64_signed62 *)sStack_1a0.v[0];
  psVar14 = (secp256k1_modinv64_signed62 *)-0x1000003d1;
  psStack_260 = a_02;
  sStack_1a0.v[1] = (int64_t)a_02;
  sStack_1a0.v[2] = uStack_268;
  sStack_1a0.v[3] = (int64_t)psStack_228;
  sStack_1a0.v[4] = uVar8;
  sStack_170.v[0] = sStack_1a0.v[0];
  sStack_170.v[1] = (int64_t)a_02;
  sStack_170.v[2] = uStack_268;
  sStack_170.v[3] = (int64_t)psStack_228;
  sStack_170.v[4] = uVar8;
  do {
    psVar18 = (secp256k1_modinv64_modinfo *)0x8;
    lVar9 = 3;
    uVar4 = 0;
    psVar22 = (secp256k1_modinv64_signed62 *)0x0;
    psVar30 = (secp256k1_modinv64_modinfo *)0x8;
    psVar5 = psVar23;
    psVar32 = psVar14;
    do {
      psStack_1b8 = psVar13;
      if (((ulong)psVar32 & 1) == 0) {
        pcStack_278 = (code *)0x11ba6a;
        secp256k1_fe_inv_cold_30();
        psVar21 = a_02;
LAB_0011ba6a:
        pcStack_278 = (code *)0x11ba6f;
        secp256k1_fe_inv_cold_1();
LAB_0011ba6f:
        pcStack_278 = (code *)0x11ba74;
        secp256k1_fe_inv_cold_2();
LAB_0011ba74:
        pcStack_278 = (code *)0x11ba79;
        secp256k1_fe_inv_cold_29();
        psVar5 = psVar24;
        goto LAB_0011ba79;
      }
      psVar24 = (secp256k1_modinv64_signed62 *)
                (uVar4 * (long)psVar23 + (long)psVar18 * (long)psVar14);
      psVar21 = (secp256k1_modinv64_signed62 *)((long)psVar32 << ((byte)lVar9 & 0x3f));
      if (psVar24 != psVar21) goto LAB_0011ba6a;
      psVar24 = (secp256k1_modinv64_signed62 *)
                ((long)psVar30 * (long)psVar23 + (long)psVar22 * (long)psVar14);
      psVar21 = (secp256k1_modinv64_signed62 *)((long)psVar5 << ((byte)lVar9 & 0x3f));
      if (psVar24 != psVar21) goto LAB_0011ba6f;
      a_02 = (secp256k1_modinv64_signed62 *)((long)a_01 >> 0x3f);
      uStack_1b0 = (ulong)((uint)psVar5 & 1);
      uVar11 = -uStack_1b0;
      psVar24 = (secp256k1_modinv64_signed62 *)((ulong)a_02 & uVar11);
      a_01 = (secp256k1_fe *)((ulong)a_01 ^ (ulong)psVar24);
      psVar21 = a_02;
      psStack_1a8 = a_02;
      if ((undefined1 *)((long)a_01[-0xd].n + 0x1fU) < (undefined1 *)0xfffffffffffffb61)
      goto LAB_0011ba74;
      a_01 = (secp256k1_fe *)((long)&a_01[-1].normalized + 3);
      psVar30 = (secp256k1_modinv64_modinfo *)
                ((long)(psVar30->modulus).v + (((ulong)a_02 ^ uVar4) - (long)a_02 & uVar11));
      uVar4 = (uVar4 + ((ulong)psVar30 & (ulong)psVar24)) * 2;
      psVar22 = (secp256k1_modinv64_signed62 *)
                ((long)psVar22->v + (((ulong)a_02 ^ (ulong)psVar18) - (long)a_02 & uVar11));
      psVar18 = (secp256k1_modinv64_modinfo *)
                (((long)(psVar18->modulus).v + ((ulong)psVar22 & (ulong)psVar24)) * 2);
      uVar11 = (long)psVar5->v + (((ulong)a_02 ^ (ulong)psVar32) - (long)a_02 & uVar11);
      psVar5 = (secp256k1_modinv64_signed62 *)(uVar11 >> 1);
      psVar32 = (secp256k1_modinv64_signed62 *)((long)psVar32->v + (uVar11 & (ulong)psVar24));
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x3e);
    psVar21 = (secp256k1_modinv64_signed62 *)(uVar4 * (long)psVar22);
    psVar13 = SUB168(SEXT816((long)uVar4) * SEXT816((long)psVar22),8);
    psVar5 = psVar24;
    sStack_140.u = (int64_t)psVar18;
    sStack_140.v = uVar4;
    sStack_140.q = (int64_t)psVar22;
    sStack_140.r = (int64_t)psVar30;
    if ((SUB168(SEXT816((long)psVar18) * SEXT816((long)psVar30),8) - (long)psVar13) -
        (ulong)((secp256k1_modinv64_signed62 *)((long)psVar18 * (long)psVar30) < psVar21) != 2 ||
        (long)psVar18 * (long)psVar30 - (long)psVar21 != 0) {
LAB_0011ba79:
      pcStack_278 = (code *)0x11ba7e;
      secp256k1_fe_inv_cold_3();
LAB_0011ba7e:
      pcStack_278 = (code *)0x11ba83;
      secp256k1_fe_inv_cold_28();
LAB_0011ba83:
      pcStack_278 = (code *)0x11ba88;
      secp256k1_fe_inv_cold_27();
LAB_0011ba88:
      pcStack_278 = (code *)0x11ba8d;
      secp256k1_fe_inv_cold_26();
LAB_0011ba8d:
      pcStack_278 = (code *)0x11ba92;
      secp256k1_fe_inv_cold_25();
LAB_0011ba92:
      pcStack_278 = (code *)0x11ba97;
      secp256k1_fe_inv_cold_4();
LAB_0011ba97:
      pcStack_278 = (code *)0x11ba9c;
      secp256k1_fe_inv_cold_5();
LAB_0011ba9c:
      pcStack_278 = (code *)0x11baa1;
      secp256k1_fe_inv_cold_6();
LAB_0011baa1:
      pcStack_278 = (code *)0x11baa6;
      secp256k1_fe_inv_cold_7();
LAB_0011baa6:
      pcStack_278 = (code *)0x11baab;
      secp256k1_fe_inv_cold_8();
LAB_0011baab:
      pcStack_278 = (code *)0x11bab0;
      secp256k1_fe_inv_cold_9();
LAB_0011bab0:
      pcStack_278 = (code *)0x11bab5;
      secp256k1_fe_inv_cold_10();
      psVar32 = psVar14;
LAB_0011bab5:
      pcStack_278 = (code *)0x11baba;
      secp256k1_fe_inv_cold_11();
      psVar24 = psStack_238;
LAB_0011baba:
      psStack_238 = psVar24;
      pcStack_278 = (code *)0x11babf;
      secp256k1_fe_inv_cold_12();
      psVar13 = psVar18;
      uVar8 = uVar4;
LAB_0011babf:
      pcStack_278 = (code *)0x11bac4;
      secp256k1_fe_inv_cold_13();
      psVar34 = psVar22;
LAB_0011bac4:
      pcStack_278 = (code *)0x11bac9;
      secp256k1_fe_inv_cold_14();
LAB_0011bac9:
      pcStack_278 = (code *)0x11bace;
      secp256k1_fe_inv_cold_15();
LAB_0011bace:
      pcStack_278 = (code *)0x11bad3;
      secp256k1_fe_inv_cold_24();
      a_02 = psVar21;
      psVar24 = psVar5;
LAB_0011bad3:
      pcStack_278 = (code *)0x11bad8;
      secp256k1_fe_inv_cold_23();
LAB_0011bad8:
      pcStack_278 = (code *)0x11badd;
      secp256k1_fe_inv_cold_22();
LAB_0011badd:
      pcStack_278 = (code *)0x11bae2;
      secp256k1_fe_inv_cold_21();
LAB_0011bae2:
      pcStack_278 = (code *)0x11bae7;
      secp256k1_fe_inv_cold_20();
LAB_0011bae7:
      psVar14 = psVar32;
      pcStack_278 = (code *)0x11baec;
      secp256k1_fe_inv_cold_19();
      goto LAB_0011baec;
    }
    pcStack_278 = (code *)0x11b0fc;
    psStack_258 = psVar23;
    psStack_240 = psVar14;
    uStack_1c0 = uVar8;
    secp256k1_modinv64_update_de_62(&sStack_120,&sStack_f0,&sStack_140,psVar13);
    psVar14 = &sStack_220;
    psVar21 = (secp256k1_modinv64_signed62 *)0x5;
    pcStack_278 = (code *)0x11b11c;
    psVar5 = psVar14;
    iVar3 = secp256k1_modinv64_mul_cmp_62(psVar14,5,&secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar3 < 1) goto LAB_0011ba7e;
    psVar21 = (secp256k1_modinv64_signed62 *)0x5;
    pcStack_278 = (code *)0x11b13d;
    psVar5 = psVar14;
    iVar3 = secp256k1_modinv64_mul_cmp_62(psVar14,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (0 < iVar3) goto LAB_0011ba83;
    psVar14 = &sStack_170;
    psVar21 = (secp256k1_modinv64_signed62 *)0x5;
    pcStack_278 = (code *)0x11b168;
    psVar5 = psVar14;
    iVar3 = secp256k1_modinv64_mul_cmp_62(psVar14,5,&secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar3 < 1) goto LAB_0011ba88;
    psVar21 = (secp256k1_modinv64_signed62 *)0x5;
    pcStack_278 = (code *)0x11b189;
    psVar5 = psVar14;
    iVar3 = secp256k1_modinv64_mul_cmp_62(psVar14,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar3) goto LAB_0011ba8d;
    psVar5 = (secp256k1_modinv64_signed62 *)((long)psVar18 * (long)psStack_240);
    lVar9 = SUB168(SEXT816((long)psVar18) * SEXT816((long)psStack_240),8);
    uVar8 = uVar4 * (long)psStack_258;
    psVar21 = SUB168(SEXT816((long)uVar4) * SEXT816((long)psStack_258),8);
    if ((-1 < (long)psVar21) &&
       (uVar11 = (ulong)((secp256k1_modinv64_signed62 *)(-1 - uVar8) < psVar5),
       lVar10 = (0x7fffffffffffffff - (long)psVar21) - lVar9,
       (SBORROW8(0x7fffffffffffffff - (long)psVar21,lVar9) != SBORROW8(lVar10,uVar11)) !=
       (long)(lVar10 - uVar11) < 0)) goto LAB_0011ba92;
    piVar25 = (int64_t *)((long)psVar5->v + uVar8);
    psVar21 = (secp256k1_modinv64_signed62 *)
              ((long)psVar21->v + (ulong)CARRY8(uVar8,(ulong)psVar5) + lVar9);
    uVar8 = (long)psVar22 * (long)psStack_240;
    psVar5 = SUB168(SEXT816((long)psVar22) * SEXT816((long)psStack_240),8);
    uVar11 = (long)psVar30 * (long)psStack_258;
    lVar9 = SUB168(SEXT816((long)psVar30) * SEXT816((long)psStack_258),8);
    if ((-1 < lVar9) &&
       (uVar12 = (ulong)(-uVar11 - 1 < uVar8), lVar10 = (0x7fffffffffffffff - lVar9) - (long)psVar5,
       (SBORROW8(0x7fffffffffffffff - lVar9,(long)psVar5) != SBORROW8(lVar10,uVar12)) !=
       (long)(lVar10 - uVar12) < 0)) goto LAB_0011ba97;
    psVar5 = (secp256k1_modinv64_signed62 *)((long)psVar5->v + (ulong)CARRY8(uVar8,uVar11) + lVar9);
    if (((ulong)piVar25 & 0x3ffffffffffffffe) != 0) goto LAB_0011ba9c;
    if ((uVar8 + uVar11 & 0x3fffffffffffffff) != 0) goto LAB_0011baa1;
    uVar12 = (ulong)piVar25 >> 0x3e | (long)psVar21 * 4;
    psStack_240 = (secp256k1_modinv64_signed62 *)((long)psVar18 * (long)psStack_238 + uVar12);
    lVar10 = SUB168(SEXT816((long)psVar18) * SEXT816((long)psStack_238),8) + ((long)psVar21 >> 0x3e)
             + (ulong)CARRY8((long)psVar18 * (long)psStack_238,uVar12);
    psStack_258 = (secp256k1_modinv64_signed62 *)(uVar4 * (long)psStack_260);
    psVar14 = SUB168(SEXT816((long)uVar4) * SEXT816((long)psStack_260),8);
    uVar12 = (ulong)((secp256k1_modinv64_signed62 *)(-1 - (long)psStack_258) < psStack_240);
    lVar9 = (0x7fffffffffffffff - (long)psVar14) - lVar10;
    psVar21 = (secp256k1_modinv64_signed62 *)
              ((-0x8000000000000000 - (long)psVar14) -
              (ulong)(psStack_258 != (secp256k1_modinv64_signed62 *)0x0));
    bVar35 = (SBORROW8(0x7fffffffffffffff - (long)psVar14,lVar10) != SBORROW8(lVar9,uVar12)) ==
             (long)(lVar9 - uVar12) < 0;
    if ((long)psVar14 < 0) {
      bVar35 = (SBORROW8(lVar10,(long)psVar21) !=
               SBORROW8(lVar10 - (long)psVar21,
                        (ulong)(psStack_240 < (secp256k1_modinv64_signed62 *)-(long)psStack_258)))
               == (long)((lVar10 - (long)psVar21) -
                        (ulong)(psStack_240 < (secp256k1_modinv64_signed62 *)-(long)psStack_258)) <
                  0;
    }
    if (!bVar35) goto LAB_0011baa6;
    uVar8 = uVar8 + uVar11 >> 0x3e | (long)psVar5 * 4;
    uVar12 = (long)psVar22 * (long)psStack_238 + uVar8;
    psVar21 = (secp256k1_modinv64_signed62 *)
              (SUB168(SEXT816((long)psVar22) * SEXT816((long)psStack_238),8) +
               ((long)psVar5 >> 0x3e) + (ulong)CARRY8((long)psVar22 * (long)psStack_238,uVar8));
    uVar11 = (long)psVar30 * (long)psStack_260;
    lVar15 = SUB168(SEXT816((long)psVar30) * SEXT816((long)psStack_260),8);
    uVar8 = (ulong)(-uVar11 - 1 < uVar12);
    lVar9 = (0x7fffffffffffffff - lVar15) - (long)psVar21;
    lVar28 = (-0x8000000000000000 - lVar15) - (ulong)(uVar11 != 0);
    lVar16 = (long)psVar21 - lVar28;
    bVar35 = (SBORROW8(0x7fffffffffffffff - lVar15,(long)psVar21) != SBORROW8(lVar9,uVar8)) ==
             (long)(lVar9 - uVar8) < 0;
    if (lVar15 < 0) {
      bVar35 = (SBORROW8((long)psVar21,lVar28) != SBORROW8(lVar16,(ulong)(uVar12 < -uVar11))) ==
               (long)(lVar16 - (ulong)(uVar12 < -uVar11)) < 0;
    }
    psVar5 = (secp256k1_modinv64_signed62 *)(ulong)bVar35;
    if (bVar35 == false) goto LAB_0011baab;
    uVar20 = (long)psStack_258->v + (long)psStack_240->v;
    lVar9 = (long)psVar14->v + (ulong)CARRY8((ulong)psStack_240,(ulong)psStack_258) + lVar10;
    psVar21 = (secp256k1_modinv64_signed62 *)
              ((long)psVar21->v + (ulong)CARRY8(uVar12,uVar11) + lVar15);
    uVar8 = lVar9 * 4 | uVar20 >> 0x3e;
    psStack_240 = (secp256k1_modinv64_signed62 *)(uVar20 & 0x3fffffffffffffff);
    psVar14 = (secp256k1_modinv64_signed62 *)(uVar12 + uVar11 & 0x3fffffffffffffff);
    psVar24 = (secp256k1_modinv64_signed62 *)((long)psVar18 * (long)psStack_248 + uVar8);
    lVar10 = (lVar9 >> 0x3e) + SUB168(SEXT816((long)psVar18) * SEXT816((long)psStack_248),8) +
             (ulong)CARRY8((long)psVar18 * (long)psStack_248,uVar8);
    uStack_1c8 = uVar4 * uStack_268;
    psStack_260 = SUB168(SEXT816((long)uVar4) * SEXT816((long)uStack_268),8);
    uVar8 = (ulong)((secp256k1_modinv64_signed62 *)(-1 - uStack_1c8) < psVar24);
    lVar9 = (0x7fffffffffffffff - (long)psStack_260) - lVar10;
    psVar5 = (secp256k1_modinv64_signed62 *)
             ((-0x8000000000000000 - (long)psStack_260) - (ulong)(uStack_1c8 != 0));
    bVar35 = (SBORROW8(0x7fffffffffffffff - (long)psStack_260,lVar10) != SBORROW8(lVar9,uVar8)) ==
             (long)(lVar9 - uVar8) < 0;
    if ((long)psStack_260 < 0) {
      bVar35 = (SBORROW8(lVar10,(long)psVar5) !=
               SBORROW8(lVar10 - (long)psVar5,
                        (ulong)(psVar24 < (secp256k1_modinv64_signed62 *)-uStack_1c8))) ==
               (long)((lVar10 - (long)psVar5) -
                     (ulong)(psVar24 < (secp256k1_modinv64_signed62 *)-uStack_1c8)) < 0;
    }
    psStack_258 = psVar14;
    psStack_238 = psVar24;
    sStack_220.v[0] = (int64_t)psStack_240;
    sStack_170.v[0] = (int64_t)psVar14;
    if (!bVar35) goto LAB_0011bab0;
    uVar8 = uVar12 + uVar11 >> 0x3e | (long)psVar21 * 4;
    uVar12 = (long)psVar22 * (long)psStack_248 + uVar8;
    psVar5 = (secp256k1_modinv64_signed62 *)
             (SUB168(SEXT816((long)psVar22) * SEXT816((long)psStack_248),8) +
              ((long)psVar21 >> 0x3e) + (ulong)CARRY8((long)psVar22 * (long)psStack_248,uVar8));
    uVar11 = (long)psVar30 * uStack_268;
    lVar15 = SUB168(SEXT816((long)psVar30) * SEXT816((long)uStack_268),8);
    uVar8 = (ulong)(-uVar11 - 1 < uVar12);
    lVar9 = (0x7fffffffffffffff - lVar15) - (long)psVar5;
    lVar28 = (-0x8000000000000000 - lVar15) - (ulong)(uVar11 != 0);
    lVar16 = (long)psVar5 - lVar28;
    bVar35 = (SBORROW8(0x7fffffffffffffff - lVar15,(long)psVar5) != SBORROW8(lVar9,uVar8)) ==
             (long)(lVar9 - uVar8) < 0;
    if (lVar15 < 0) {
      bVar35 = (SBORROW8((long)psVar5,lVar28) != SBORROW8(lVar16,(ulong)(uVar12 < -uVar11))) ==
               (long)(lVar16 - (ulong)(uVar12 < -uVar11)) < 0;
    }
    psVar21 = (secp256k1_modinv64_signed62 *)(ulong)bVar35;
    psVar32 = psVar14;
    if (bVar35 == false) goto LAB_0011bab5;
    piVar25 = (int64_t *)((long)psVar24->v + uStack_1c8);
    lVar9 = (long)psStack_260->v + (ulong)CARRY8((ulong)psVar24,uStack_1c8) + lVar10;
    psVar5 = (secp256k1_modinv64_signed62 *)
             ((long)psVar5->v + (ulong)CARRY8(uVar12,uVar11) + lVar15);
    uVar8 = lVar9 * 4 | (ulong)piVar25 >> 0x3e;
    psStack_238 = (secp256k1_modinv64_signed62 *)((ulong)piVar25 & 0x3fffffffffffffff);
    psStack_260 = (secp256k1_modinv64_signed62 *)(uVar12 + uVar11 & 0x3fffffffffffffff);
    psStack_248 = (secp256k1_modinv64_signed62 *)((long)psVar18 * (long)psStack_250 + uVar8);
    lVar10 = (lVar9 >> 0x3e) + SUB168(SEXT816((long)psVar18) * SEXT816((long)psStack_250),8) +
             (ulong)CARRY8((long)psVar18 * (long)psStack_250,uVar8);
    uStack_268 = uVar4 * (long)psStack_228;
    lVar16 = SUB168(SEXT816((long)uVar4) * SEXT816((long)psStack_228),8);
    uVar8 = (ulong)((secp256k1_modinv64_signed62 *)(-1 - uStack_268) < psStack_248);
    lVar9 = (0x7fffffffffffffff - lVar16) - lVar10;
    psVar21 = (secp256k1_modinv64_signed62 *)
              ((-0x8000000000000000 - lVar16) - (ulong)(uStack_268 != 0));
    bVar35 = (SBORROW8(0x7fffffffffffffff - lVar16,lVar10) != SBORROW8(lVar9,uVar8)) ==
             (long)(lVar9 - uVar8) < 0;
    if (lVar16 < 0) {
      bVar35 = (SBORROW8(lVar10,(long)psVar21) !=
               SBORROW8(lVar10 - (long)psVar21,
                        (ulong)(psStack_248 < (secp256k1_modinv64_signed62 *)-uStack_268))) ==
               (long)((lVar10 - (long)psVar21) -
                     (ulong)(psStack_248 < (secp256k1_modinv64_signed62 *)-uStack_268)) < 0;
    }
    psVar32 = psStack_238;
    sStack_220.v[1] = (int64_t)psStack_238;
    sStack_170.v[1] = (int64_t)psStack_260;
    if (!bVar35) goto LAB_0011baba;
    uVar8 = uVar12 + uVar11 >> 0x3e | (long)psVar5 * 4;
    psVar32 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
    uVar12 = (long)psVar22 * (long)psStack_250 + uVar8;
    psVar21 = (secp256k1_modinv64_signed62 *)
              (SUB168(SEXT816((long)psVar22) * SEXT816((long)psStack_250),8) +
               ((long)psVar5 >> 0x3e) + (ulong)CARRY8((long)psVar22 * (long)psStack_250,uVar8));
    uVar11 = (long)psVar30 * (long)psStack_228;
    lVar28 = SUB168(SEXT816((long)psVar30) * SEXT816((long)psStack_228),8);
    uVar8 = (ulong)(-uVar11 - 1 < uVar12);
    lVar9 = (0x7fffffffffffffff - lVar28) - (long)psVar21;
    lVar29 = (-0x8000000000000000 - lVar28) - (ulong)(uVar11 != 0);
    lVar15 = (long)psVar21 - lVar29;
    bVar35 = (SBORROW8(0x7fffffffffffffff - lVar28,(long)psVar21) != SBORROW8(lVar9,uVar8)) ==
             (long)(lVar9 - uVar8) < 0;
    if (lVar28 < 0) {
      bVar35 = (SBORROW8((long)psVar21,lVar29) != SBORROW8(lVar15,(ulong)(uVar12 < -uVar11))) ==
               (long)(lVar15 - (ulong)(uVar12 < -uVar11)) < 0;
    }
    psVar5 = (secp256k1_modinv64_signed62 *)(ulong)bVar35;
    psVar13 = psVar18;
    uVar8 = uVar4;
    if (bVar35 == false) goto LAB_0011babf;
    piVar25 = (int64_t *)((long)psStack_248->v + uStack_268);
    lVar9 = lVar10 + lVar16 + (ulong)CARRY8((ulong)psStack_248,uStack_268);
    psVar21 = (secp256k1_modinv64_signed62 *)
              ((long)psVar21->v + (ulong)CARRY8(uVar12,uVar11) + lVar28);
    uVar8 = lVar9 * 4 | (ulong)piVar25 >> 0x3e;
    psVar32 = (secp256k1_modinv64_signed62 *)((ulong)piVar25 & 0x3fffffffffffffff);
    uStack_268 = uVar12 + uVar11 & 0x3fffffffffffffff;
    psStack_250 = (secp256k1_modinv64_signed62 *)((long)psVar18 * (long)psStack_230 + uVar8);
    lVar10 = (lVar9 >> 0x3e) + SUB168(SEXT816((long)psVar18) * SEXT816((long)psStack_230),8) +
             (ulong)CARRY8((long)psVar18 * (long)psStack_230,uVar8);
    uVar20 = uVar4 * uStack_1c0;
    psVar5 = SUB168(SEXT816((long)uVar4) * SEXT816((long)uStack_1c0),8);
    uVar8 = (ulong)((secp256k1_modinv64_signed62 *)(-1 - uVar20) < psStack_250);
    lVar9 = (0x7fffffffffffffff - (long)psVar5) - lVar10;
    bVar35 = (SBORROW8(0x7fffffffffffffff - (long)psVar5,lVar10) != SBORROW8(lVar9,uVar8)) ==
             (long)(lVar9 - uVar8) < 0;
    uVar8 = CONCAT71((int7)(uVar4 >> 8),bVar35);
    lVar16 = (-0x8000000000000000 - (long)psVar5) - (ulong)(uVar20 != 0);
    lVar9 = lVar10 - lVar16;
    if ((long)psVar5 < 0) {
      bVar35 = (SBORROW8(lVar10,lVar16) !=
               SBORROW8(lVar9,(ulong)(psStack_250 < (secp256k1_modinv64_signed62 *)-uVar20))) ==
               (long)(lVar9 - (ulong)(psStack_250 < (secp256k1_modinv64_signed62 *)-uVar20)) < 0;
    }
    psVar13 = psStack_230;
    psVar34 = psVar22;
    sStack_220.v[2] = (int64_t)psVar32;
    sStack_170.v[2] = uStack_268;
    if (!bVar35) goto LAB_0011bac4;
    uVar4 = uVar12 + uVar11 >> 0x3e | (long)psVar21 * 4;
    psVar34 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
    uVar8 = (long)psVar22 * (long)psStack_230 + uVar4;
    lVar28 = SUB168(SEXT816((long)psVar22) * SEXT816((long)psStack_230),8) + ((long)psVar21 >> 0x3e)
             + (ulong)CARRY8((long)psVar22 * (long)psStack_230,uVar4);
    uVar11 = (long)psVar30 * uStack_1c0;
    lVar15 = SUB168(SEXT816((long)psVar30) * SEXT816((long)uStack_1c0),8);
    uVar4 = (ulong)(-uVar11 - 1 < uVar8);
    lVar9 = (0x7fffffffffffffff - lVar15) - lVar28;
    lVar29 = (-0x8000000000000000 - lVar15) - (ulong)(uVar11 != 0);
    lVar16 = lVar28 - lVar29;
    bVar35 = (SBORROW8(0x7fffffffffffffff - lVar15,lVar28) != SBORROW8(lVar9,uVar4)) ==
             (long)(lVar9 - uVar4) < 0;
    if (lVar15 < 0) {
      bVar35 = (SBORROW8(lVar28,lVar29) != SBORROW8(lVar16,(ulong)(uVar8 < -uVar11))) ==
               (long)(lVar16 - (ulong)(uVar8 < -uVar11)) < 0;
    }
    psVar21 = (secp256k1_modinv64_signed62 *)(ulong)bVar35;
    if (bVar35 == false) goto LAB_0011bac9;
    piVar25 = (int64_t *)((long)psStack_250->v + uVar20);
    lVar9 = (long)psVar5->v + (ulong)CARRY8((ulong)psStack_250,uVar20) + lVar10;
    bVar35 = CARRY8(uVar8,uVar11);
    uVar8 = uVar8 + uVar11;
    lVar10 = lVar28 + lVar15 + (ulong)bVar35;
    psVar30 = (secp256k1_modinv64_modinfo *)(lVar9 * 4 | (ulong)piVar25 >> 0x3e);
    psVar21 = (secp256k1_modinv64_signed62 *)((ulong)piVar25 & 0x3fffffffffffffff);
    psVar5 = (secp256k1_modinv64_signed62 *)(uVar8 & 0x3fffffffffffffff);
    sStack_220.v[3] = (int64_t)psVar21;
    sStack_170.v[3] = (int64_t)psVar5;
    if ((lVar9 >> 0x3e) + -1 + (ulong)((secp256k1_modinv64_modinfo *)0x7fffffffffffffff < psVar30)
        != -1) goto LAB_0011bace;
    uVar8 = uVar8 >> 0x3e | lVar10 * 4;
    a_02 = psVar21;
    psVar24 = psVar5;
    sStack_220.v[4] = (int64_t)psVar30;
    if ((lVar10 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar8) != -1) goto LAB_0011bad3;
    psVar34 = &sStack_220;
    a_02 = (secp256k1_modinv64_signed62 *)0x5;
    psVar13 = &secp256k1_const_modinfo_fe;
    pcStack_278 = (code *)0x11b7cf;
    psVar24 = psVar34;
    psStack_250 = psVar21;
    psStack_228 = psVar5;
    sStack_170.v[4] = uVar8;
    iVar3 = secp256k1_modinv64_mul_cmp_62(psVar34,5,&secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar3 < 1) goto LAB_0011bad8;
    a_02 = (secp256k1_modinv64_signed62 *)0x5;
    pcStack_278 = (code *)0x11b7ec;
    psVar24 = psVar34;
    iVar3 = secp256k1_modinv64_mul_cmp_62(psVar34,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (0 < iVar3) goto LAB_0011badd;
    psVar34 = &sStack_170;
    a_02 = (secp256k1_modinv64_signed62 *)0x5;
    pcStack_278 = (code *)0x11b813;
    psVar24 = psVar34;
    iVar3 = secp256k1_modinv64_mul_cmp_62(psVar34,5,&secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar3 < 1) goto LAB_0011bae2;
    a_02 = (secp256k1_modinv64_signed62 *)0x5;
    pcStack_278 = (code *)0x11b835;
    psVar24 = psVar34;
    psStack_230 = psVar30;
    iVar3 = secp256k1_modinv64_mul_cmp_62(psVar34,5,&secp256k1_const_modinfo_fe.modulus,1);
    psVar14 = psStack_240;
    psVar13 = psStack_1b8;
    if (-1 < iVar3) goto LAB_0011bae7;
    uVar17 = (int)psStack_1b8 + 1;
    psVar13 = (secp256k1_modinv64_modinfo *)(ulong)uVar17;
    psVar23 = psStack_258;
    psStack_248 = psVar32;
  } while (uVar17 != 10);
  psVar24 = &sStack_170;
  a_02 = (secp256k1_modinv64_signed62 *)0x5;
  pcStack_278 = (code *)0x11b87d;
  iVar3 = secp256k1_modinv64_mul_cmp_62(psVar24,5,&SECP256K1_SIGNED62_ONE,0);
  if (iVar3 == 0) {
    pcStack_278 = (code *)0x11b8a2;
    iVar3 = secp256k1_modinv64_mul_cmp_62(&sStack_220,5,&SECP256K1_SIGNED62_ONE,-1);
    psVar18 = extraout_RDX;
    if (iVar3 == 0) {
LAB_0011b932:
      pcStack_278 = (code *)0x11b947;
      secp256k1_modinv64_normalize_62(&sStack_120,(int64_t)psStack_230,psVar18);
      a_01 = psStack_1d0;
      sStack_1a0.v[4] = sStack_120.v[4];
      sStack_1a0.v[2] = sStack_120.v[2];
      sStack_1a0.v[3] = sStack_120.v[3];
      sStack_1a0.v[0] = sStack_120.v[0];
      sStack_1a0.v[1] = sStack_120.v[1];
      pcStack_278 = (code *)0x11b975;
      secp256k1_fe_from_signed62(psStack_1d0,&sStack_1a0);
      a_01->magnitude = (uint)(0 < psStack_1e8->magnitude);
      a_01->normalized = 1;
      pcStack_278 = (code *)0x11b998;
      secp256k1_fe_verify(a_01);
      uVar11 = (a_01->n[4] >> 0x30) * lStack_1f0 + a_01->n[0];
      uVar4 = (uVar11 >> 0x34) + a_01->n[1];
      uVar12 = (uVar4 >> 0x34) + a_01->n[2];
      uVar20 = (uVar12 >> 0x34) + a_01->n[3];
      a_02 = (secp256k1_modinv64_signed62 *)((uVar20 >> 0x34) + (a_01->n[4] & 0xffffffffffff));
      psVar24 = (secp256k1_modinv64_signed62 *)
                ((uVar11 ^ 0x1000003d0) & uVar4 & uVar12 & uVar20 & ((ulong)a_02 ^ 0xf000000000000))
      ;
      if ((uStack_1e0 != 0xfffffffffffff && uStack_1d8 != 0) !=
          (psVar24 == (secp256k1_modinv64_signed62 *)0xfffffffffffff ||
          ((uVar4 | uVar11 | uVar12 | uVar20) & 0xfffffffffffff) == 0 &&
          a_02 == (secp256k1_modinv64_signed62 *)0x0)) {
        secp256k1_fe_verify(a_01);
        return;
      }
      goto LAB_0011baf1;
    }
    pcStack_278 = (code *)0x11b8c5;
    iVar3 = secp256k1_modinv64_mul_cmp_62(&sStack_220,5,&SECP256K1_SIGNED62_ONE,1);
    psVar18 = extraout_RDX_00;
    if (iVar3 == 0) goto LAB_0011b932;
    psVar24 = &sStack_1a0;
    a_02 = (secp256k1_modinv64_signed62 *)0x5;
    pcStack_278 = (code *)0x11b8e4;
    iVar3 = secp256k1_modinv64_mul_cmp_62(psVar24,5,&SECP256K1_SIGNED62_ONE,0);
    if (iVar3 == 0) {
      psVar24 = &sStack_120;
      a_02 = (secp256k1_modinv64_signed62 *)0x5;
      pcStack_278 = (code *)0x11b907;
      iVar3 = secp256k1_modinv64_mul_cmp_62(psVar24,5,&SECP256K1_SIGNED62_ONE,0);
      if (iVar3 == 0) {
        psVar24 = &sStack_220;
        a_02 = (secp256k1_modinv64_signed62 *)0x5;
        pcStack_278 = (code *)0x11b92a;
        iVar3 = secp256k1_modinv64_mul_cmp_62(psVar24,5,&secp256k1_const_modinfo_fe.modulus,1);
        psVar18 = extraout_RDX_01;
        if (iVar3 == 0) goto LAB_0011b932;
      }
    }
  }
  else {
LAB_0011baec:
    pcStack_278 = (code *)0x11baf1;
    secp256k1_fe_inv_cold_16();
LAB_0011baf1:
    pcStack_278 = (code *)0x11baf6;
    secp256k1_fe_inv_cold_18();
  }
  pcStack_278 = secp256k1_fe_from_signed62;
  secp256k1_fe_inv_cold_17();
  uVar4 = a_02->v[0];
  if (uVar4 >> 0x3e == 0) {
    uVar11 = a_02->v[1];
    if (0x3fffffffffffffff < uVar11) goto LAB_0011bbca;
    uVar12 = a_02->v[2];
    if (0x3fffffffffffffff < uVar12) goto LAB_0011bbcf;
    uVar20 = a_02->v[3];
    if (0x3fffffffffffffff < uVar20) goto LAB_0011bbd4;
    uVar7 = a_02->v[4];
    if (uVar7 < 0x100) {
      psVar24->v[0] = uVar4 & 0xfffffffffffff;
      psVar24->v[1] = (uVar11 & 0x3ffffffffff) << 10 | uVar4 >> 0x34;
      psVar24->v[2] = (uVar12 & 0xffffffff) << 0x14 | uVar11 >> 0x2a;
      psVar24->v[3] = (ulong)((uint)uVar20 & 0x3fffff) << 0x1e | uVar12 >> 0x20;
      psVar24->v[4] = uVar7 << 0x28 | uVar20 >> 0x16;
      return;
    }
  }
  else {
    psStack_280 = (secp256k1_modinv64_modinfo *)0x11bbca;
    secp256k1_fe_from_signed62_cold_5();
LAB_0011bbca:
    psStack_280 = (secp256k1_modinv64_modinfo *)0x11bbcf;
    secp256k1_fe_from_signed62_cold_4();
LAB_0011bbcf:
    psStack_280 = (secp256k1_modinv64_modinfo *)0x11bbd4;
    secp256k1_fe_from_signed62_cold_3();
LAB_0011bbd4:
    psStack_280 = (secp256k1_modinv64_modinfo *)0x11bbd9;
    secp256k1_fe_from_signed62_cold_2();
  }
  psStack_280 = (secp256k1_modinv64_modinfo *)secp256k1_modinv64_update_de_62;
  secp256k1_fe_from_signed62_cold_1();
  psStack_280 = psVar13;
  psStack_288 = psVar34;
  uStack_290 = uVar8;
  psStack_298 = psVar14;
  psStack_2a0 = psVar30;
  psStack_2a8 = a_01;
  lVar9 = psVar24->v[0];
  iStack_2b0 = psVar24->v[1];
  psStack_2c0 = (secp256k1_modinv64_signed62 *)psVar24->v[2];
  iStack_2c8 = psVar24->v[3];
  psVar14 = (secp256k1_modinv64_signed62 *)psVar24->v[4];
  psStack_308 = (secp256k1_modinv64_signed62 *)a_02->v[0];
  psVar23 = (secp256k1_modinv64_signed62 *)a_02->v[1];
  iStack_2b8 = a_02->v[2];
  psVar5 = (secp256k1_modinv64_signed62 *)a_02->v[3];
  uStack_318 = *extraout_RDX_02;
  psStack_310 = (secp256k1_modinv64_signed62 *)extraout_RDX_02[1];
  uStack_328 = extraout_RDX_02[2];
  psStack_320 = (secp256k1_modinv64_signed62 *)extraout_RDX_02[3];
  iStack_2f0 = a_02->v[4];
  psVar22 = (secp256k1_modinv64_signed62 *)0x5;
  psVar32 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
  psStack_338 = (secp256k1_modinv64_signed62 *)0x11bc77;
  psVar21 = psVar24;
  iVar3 = secp256k1_modinv64_mul_cmp_62(psVar24,5,&secp256k1_const_modinfo_fe.modulus,-2);
  if (iVar3 < 1) {
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c5ac;
    secp256k1_modinv64_update_de_62_cold_28();
LAB_0011c5ac:
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c5b1;
    secp256k1_modinv64_update_de_62_cold_27();
LAB_0011c5b1:
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c5b6;
    secp256k1_modinv64_update_de_62_cold_26();
LAB_0011c5b6:
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c5bb;
    secp256k1_modinv64_update_de_62_cold_25();
LAB_0011c5bb:
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c5c0;
    secp256k1_modinv64_update_de_62_cold_24();
LAB_0011c5c0:
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c5c5;
    secp256k1_modinv64_update_de_62_cold_23();
LAB_0011c5c5:
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c5ca;
    secp256k1_modinv64_update_de_62_cold_1();
LAB_0011c5ca:
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c5cf;
    secp256k1_modinv64_update_de_62_cold_2();
    psVar34 = psVar23;
LAB_0011c5cf:
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c5d4;
    secp256k1_modinv64_update_de_62_cold_3();
LAB_0011c5d4:
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c5d9;
    secp256k1_modinv64_update_de_62_cold_4();
LAB_0011c5d9:
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c5de;
    secp256k1_modinv64_update_de_62_cold_5();
LAB_0011c5de:
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c5e3;
    secp256k1_modinv64_update_de_62_cold_6();
LAB_0011c5e3:
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c5e8;
    secp256k1_modinv64_update_de_62_cold_7();
    psVar23 = psVar22;
LAB_0011c5e8:
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c5ed;
    secp256k1_modinv64_update_de_62_cold_8();
LAB_0011c5ed:
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c5f2;
    secp256k1_modinv64_update_de_62_cold_9();
LAB_0011c5f2:
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c5f7;
    secp256k1_modinv64_update_de_62_cold_10();
LAB_0011c5f7:
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c5fc;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_0011c5fc:
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c601;
    secp256k1_modinv64_update_de_62_cold_12();
LAB_0011c601:
    iVar3 = (int)psVar23;
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c606;
    secp256k1_modinv64_update_de_62_cold_13();
LAB_0011c606:
    iVar19 = iVar3;
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c60b;
    secp256k1_modinv64_update_de_62_cold_14();
LAB_0011c60b:
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c610;
    secp256k1_modinv64_update_de_62_cold_15();
LAB_0011c610:
    alen = iVar19;
    psVar24 = psVar34;
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c615;
    secp256k1_modinv64_update_de_62_cold_16();
LAB_0011c615:
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c61a;
    secp256k1_modinv64_update_de_62_cold_22();
LAB_0011c61a:
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c61f;
    secp256k1_modinv64_update_de_62_cold_21();
LAB_0011c61f:
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c624;
    secp256k1_modinv64_update_de_62_cold_20();
LAB_0011c624:
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c629;
    secp256k1_modinv64_update_de_62_cold_19();
LAB_0011c629:
    a_02 = psVar21;
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c62e;
    secp256k1_modinv64_update_de_62_cold_18();
  }
  else {
    psVar32 = (secp256k1_modinv64_signed62 *)0x1;
    psVar22 = (secp256k1_modinv64_signed62 *)0x5;
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11bc98;
    psVar21 = psVar24;
    iVar3 = secp256k1_modinv64_mul_cmp_62(psVar24,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar3) goto LAB_0011c5ac;
    psVar22 = (secp256k1_modinv64_signed62 *)0x5;
    psVar32 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11bcbb;
    psVar21 = a_02;
    iVar3 = secp256k1_modinv64_mul_cmp_62(a_02,5,&secp256k1_const_modinfo_fe.modulus,-2);
    if (iVar3 < 1) goto LAB_0011c5b1;
    psVar32 = (secp256k1_modinv64_signed62 *)0x1;
    psVar22 = (secp256k1_modinv64_signed62 *)0x5;
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11bcdc;
    psVar21 = a_02;
    iVar3 = secp256k1_modinv64_mul_cmp_62(a_02,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar3) goto LAB_0011c5b6;
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11bd02;
    psStack_2f8 = psVar14;
    psStack_2d8 = psVar5;
    psVar5 = (secp256k1_modinv64_signed62 *)secp256k1_modinv64_abs(uStack_318);
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11bd0f;
    psVar21 = psStack_310;
    iVar6 = secp256k1_modinv64_abs((int64_t)psStack_310);
    psVar32 = (secp256k1_modinv64_signed62 *)(0x4000000000000000 - iVar6);
    psVar14 = (secp256k1_modinv64_signed62 *)0x3fffffffffffffff;
    if ((long)psVar32 < (long)psVar5) goto LAB_0011c5bb;
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11bd2b;
    psVar5 = (secp256k1_modinv64_signed62 *)secp256k1_modinv64_abs(uStack_328);
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11bd38;
    psVar21 = psStack_320;
    iVar6 = secp256k1_modinv64_abs((int64_t)psStack_320);
    psVar32 = (secp256k1_modinv64_signed62 *)(0x4000000000000000 - iVar6);
    if ((long)psVar32 < (long)psVar5) goto LAB_0011c5c0;
    psVar14 = (secp256k1_modinv64_signed62 *)0x7fffffffffffffff;
    psVar22 = (secp256k1_modinv64_signed62 *)(uStack_318 * lVar9);
    psVar32 = SUB168(SEXT816((long)uStack_318) * SEXT816(lVar9),8);
    uVar8 = (long)psStack_310 * (long)psStack_308;
    lVar16 = SUB168(SEXT816((long)psStack_310) * SEXT816((long)psStack_308),8);
    lVar10 = (0x7fffffffffffffff - lVar16) - (long)psVar32;
    psVar21 = psStack_308;
    psStack_2d0 = psVar23;
    if (-1 < lVar16 &&
        (SBORROW8(0x7fffffffffffffff - lVar16,(long)psVar32) !=
        SBORROW8(lVar10,(ulong)((secp256k1_modinv64_signed62 *)~uVar8 < psVar22))) !=
        (long)(lVar10 - (ulong)((secp256k1_modinv64_signed62 *)~uVar8 < psVar22)) < 0)
    goto LAB_0011c5c5;
    piVar25 = (int64_t *)((long)psVar22->v + uVar8);
    lVar28 = (long)psVar32->v + (ulong)CARRY8(uVar8,(ulong)psVar22) + lVar16;
    psVar5 = (secp256k1_modinv64_signed62 *)(uStack_328 * lVar9);
    lVar16 = SUB168(SEXT816((long)uStack_328) * SEXT816(lVar9),8);
    uVar4 = (long)psStack_320 * (long)psStack_308;
    lVar15 = SUB168(SEXT816((long)psStack_320) * SEXT816((long)psStack_308),8);
    uVar8 = (ulong)((secp256k1_modinv64_signed62 *)(-uVar4 - 1) < psVar5);
    lVar9 = (0x7fffffffffffffff - lVar15) - lVar16;
    lVar10 = lVar9 - uVar8;
    bVar35 = (SBORROW8(0x7fffffffffffffff - lVar15,lVar16) != SBORROW8(lVar9,uVar8)) == lVar10 < 0;
    psVar32 = (secp256k1_modinv64_signed62 *)
              CONCAT71((int7)((ulong)lVar10 >> 8),lVar15 < 0 || bVar35);
    if (lVar15 >= 0 && !bVar35) goto LAB_0011c5ca;
    psVar32 = (secp256k1_modinv64_signed62 *)(iStack_2f0 >> 0x3f);
    lVar9 = ((ulong)psStack_310 & (ulong)psVar32) + (uStack_318 & (long)psStack_2f8 >> 0x3f);
    piVar26 = (int64_t *)((long)psVar5->v + uVar4);
    psVar21 = (secp256k1_modinv64_signed62 *)(lVar15 + lVar16 + (ulong)CARRY8(uVar4,(ulong)psVar5));
    psStack_2e0 = (secp256k1_modinv64_signed62 *)
                  (lVar9 - ((long)piVar25 * 0x27c7f6e22ddacacf + lVar9 & 0x3fffffffffffffffU));
    psVar5 = (secp256k1_modinv64_signed62 *)((long)psStack_2e0 * -0x1000003d1);
    lVar10 = SUB168(SEXT816((long)psStack_2e0) * SEXT816(-0x1000003d1),8);
    uVar8 = (ulong)((undefined1 *)((long)psStack_2e0 * 0x1000003d1 - 1U) < piVar25);
    lVar9 = (0x7fffffffffffffff - lVar10) - lVar28;
    psVar34 = (secp256k1_modinv64_signed62 *)
              ((-0x8000000000000000 - lVar10) -
              (ulong)(psVar5 != (secp256k1_modinv64_signed62 *)0x0));
    uVar4 = (ulong)(piVar25 < (undefined1 *)((long)psStack_2e0 * 0x1000003d1));
    bVar35 = (SBORROW8(lVar28,(long)psVar34) != SBORROW8(lVar28 - (long)psVar34,uVar4)) ==
             (long)((lVar28 - (long)psVar34) - uVar4) < 0;
    if ((long)psStack_2e0 < 1) {
      bVar35 = (SBORROW8(0x7fffffffffffffff - lVar10,lVar28) != SBORROW8(lVar9,uVar8)) ==
               (long)(lVar9 - uVar8) < 0;
    }
    psVar22 = psStack_2e0;
    psStack_308 = psVar24;
    psStack_300 = a_02;
    if (!bVar35) goto LAB_0011c5cf;
    lVar9 = ((ulong)psVar32 & (ulong)psStack_320) + ((long)psStack_2f8 >> 0x3f & uStack_328);
    psVar32 = (secp256k1_modinv64_signed62 *)
              (lVar9 - ((long)piVar26 * 0x27c7f6e22ddacacf + lVar9 & 0x3fffffffffffffffU));
    bVar35 = CARRY8((ulong)psVar5,(ulong)piVar25);
    psVar5 = (secp256k1_modinv64_signed62 *)((long)piVar25 + (long)psVar5->v);
    lVar28 = lVar10 + lVar28 + (ulong)bVar35;
    psVar22 = (secp256k1_modinv64_signed62 *)((long)psVar32 >> 0x3f);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = psVar32;
    uVar4 = SUB168(auVar1 * ZEXT816(0xfffffffefffffc2f),0);
    psVar34 = (secp256k1_modinv64_signed62 *)-(long)psVar32;
    lVar16 = (long)psVar34 +
             (long)psVar22 * -0x1000003d1 + SUB168(auVar1 * ZEXT816(0xfffffffefffffc2f),8);
    uVar8 = (ulong)((undefined1 *)(-uVar4 - 1) < piVar26);
    lVar9 = (0x7fffffffffffffff - lVar16) - (long)psVar21;
    lVar15 = (-0x8000000000000000 - lVar16) - (ulong)(uVar4 != 0);
    lVar10 = (long)psVar21 - lVar15;
    bVar35 = (SBORROW8((long)psVar21,lVar15) !=
             SBORROW8(lVar10,(ulong)(piVar26 < (undefined1 *)-uVar4))) ==
             (long)(lVar10 - (ulong)(piVar26 < (undefined1 *)-uVar4)) < 0;
    if ((long)psVar32 < 1) {
      bVar35 = (SBORROW8(0x7fffffffffffffff - lVar16,(long)psVar21) != SBORROW8(lVar9,uVar8)) ==
               (long)(lVar9 - uVar8) < 0;
    }
    psStack_2e8 = psVar22;
    if (!bVar35) goto LAB_0011c5d4;
    lVar9 = (long)psVar21 + (ulong)CARRY8(uVar4,(ulong)piVar26) + lVar16;
    if (((ulong)psVar5 & 0x3fffffffffffffff) != 0) goto LAB_0011c5d9;
    if (((long)piVar26 + uVar4 & 0x3fffffffffffffff) != 0) goto LAB_0011c5de;
    uVar8 = (ulong)psVar5 >> 0x3e | lVar28 * 4;
    uVar11 = uStack_318 * iStack_2b0 + uVar8;
    psVar21 = (secp256k1_modinv64_signed62 *)
              (SUB168(SEXT816((long)uStack_318) * SEXT816(iStack_2b0),8) + (lVar28 >> 0x3e) +
              (ulong)CARRY8(uStack_318 * iStack_2b0,uVar8));
    psVar5 = (secp256k1_modinv64_signed62 *)((long)psStack_310 * (long)psVar23);
    lVar15 = SUB168(SEXT816((long)psStack_310) * SEXT816((long)psVar23),8);
    uVar8 = (ulong)(-(long)psVar5 - 1U < uVar11);
    lVar10 = (0x7fffffffffffffff - lVar15) - (long)psVar21;
    lVar28 = (-0x8000000000000000 - lVar15) - (ulong)(psVar5 != (secp256k1_modinv64_signed62 *)0x0);
    lVar16 = (long)psVar21 - lVar28;
    bVar35 = (SBORROW8(0x7fffffffffffffff - lVar15,(long)psVar21) != SBORROW8(lVar10,uVar8)) ==
             (long)(lVar10 - uVar8) < 0;
    if (lVar15 < 0) {
      bVar35 = (SBORROW8((long)psVar21,lVar28) !=
               SBORROW8(lVar16,(ulong)(uVar11 < (ulong)-(long)psVar5))) ==
               (long)(lVar16 - (ulong)(uVar11 < (ulong)-(long)psVar5)) < 0;
    }
    psVar34 = psVar23;
    if (!bVar35) goto LAB_0011c5e3;
    uVar8 = (long)piVar26 + uVar4 >> 0x3e | lVar9 * 4;
    uVar12 = uStack_328 * iStack_2b0 + uVar8;
    lVar28 = SUB168(SEXT816((long)uStack_328) * SEXT816(iStack_2b0),8) + (lVar9 >> 0x3e) +
             (ulong)CARRY8(uStack_328 * iStack_2b0,uVar8);
    uVar4 = (long)psStack_320 * (long)psVar23;
    lVar16 = SUB168(SEXT816((long)psStack_320) * SEXT816((long)psVar23),8);
    uVar8 = (ulong)(-uVar4 - 1 < uVar12);
    lVar9 = (0x7fffffffffffffff - lVar16) - lVar28;
    lVar29 = (-0x8000000000000000 - lVar16) - (ulong)(uVar4 != 0);
    lVar10 = lVar28 - lVar29;
    bVar35 = (SBORROW8(0x7fffffffffffffff - lVar16,lVar28) != SBORROW8(lVar9,uVar8)) ==
             (long)(lVar9 - uVar8) < 0;
    if (lVar16 < 0) {
      bVar35 = (SBORROW8(lVar28,lVar29) != SBORROW8(lVar10,(ulong)(uVar12 < -uVar4))) ==
               (long)(lVar10 - (ulong)(uVar12 < -uVar4)) < 0;
    }
    psVar34 = (secp256k1_modinv64_signed62 *)(ulong)bVar35;
    psVar23 = psVar22;
    if (bVar35 == false) goto LAB_0011c5e8;
    psVar23 = (secp256k1_modinv64_signed62 *)0x7fffffffffffffff;
    uVar7 = (long)psVar5->v + uVar11;
    lVar9 = (long)psVar21->v + (ulong)CARRY8(uVar11,(ulong)psVar5) + lVar15;
    lVar16 = lVar28 + lVar16 + (ulong)CARRY8(uVar12,uVar4);
    uVar8 = lVar9 * 4 | uVar7 >> 0x3e;
    psVar5 = (secp256k1_modinv64_signed62 *)(uVar12 + uVar4 & 0x3fffffffffffffff);
    uVar20 = uStack_318 * (long)psStack_2c0 + uVar8;
    psVar21 = (secp256k1_modinv64_signed62 *)
              ((lVar9 >> 0x3e) + SUB168(SEXT816((long)uStack_318) * SEXT816((long)psStack_2c0),8) +
              (ulong)CARRY8(uStack_318 * (long)psStack_2c0,uVar8));
    uVar11 = (long)psStack_310 * iStack_2b8;
    lVar10 = SUB168(SEXT816((long)psStack_310) * SEXT816(iStack_2b8),8);
    uVar8 = (ulong)(-uVar11 - 1 < uVar20);
    lVar9 = (0x7fffffffffffffff - lVar10) - (long)psVar21;
    psVar34 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - lVar10) - (ulong)(uVar11 != 0))
    ;
    psVar24->v[0] = uVar7 & 0x3fffffffffffffff;
    a_02->v[0] = (int64_t)psVar5;
    bVar35 = (SBORROW8(0x7fffffffffffffff - lVar10,(long)psVar21) != SBORROW8(lVar9,uVar8)) ==
             (long)(lVar9 - uVar8) < 0;
    if (lVar10 < 0) {
      bVar35 = (SBORROW8((long)psVar21,(long)psVar34) !=
               SBORROW8((long)psVar21 - (long)psVar34,(ulong)(uVar20 < -uVar11))) ==
               (long)(((long)psVar21 - (long)psVar34) - (ulong)(uVar20 < -uVar11)) < 0;
    }
    psVar14 = psStack_2c0;
    if (!bVar35) goto LAB_0011c5ed;
    uVar8 = uVar12 + uVar4 >> 0x3e | lVar16 * 4;
    uVar12 = uStack_328 * (long)psStack_2c0 + uVar8;
    psVar5 = (secp256k1_modinv64_signed62 *)
             (SUB168(SEXT816((long)uStack_328) * SEXT816((long)psStack_2c0),8) + (lVar16 >> 0x3e) +
             (ulong)CARRY8(uStack_328 * (long)psStack_2c0,uVar8));
    uVar4 = (long)psStack_320 * iStack_2b8;
    lVar15 = SUB168(SEXT816((long)psStack_320) * SEXT816(iStack_2b8),8);
    uVar8 = (ulong)(-uVar4 - 1 < uVar12);
    lVar9 = (0x7fffffffffffffff - lVar15) - (long)psVar5;
    lVar28 = (-0x8000000000000000 - lVar15) - (ulong)(uVar4 != 0);
    lVar16 = (long)psVar5 - lVar28;
    bVar35 = (SBORROW8(0x7fffffffffffffff - lVar15,(long)psVar5) != SBORROW8(lVar9,uVar8)) ==
             (long)(lVar9 - uVar8) < 0;
    if (lVar15 < 0) {
      bVar35 = (SBORROW8((long)psVar5,lVar28) != SBORROW8(lVar16,(ulong)(uVar12 < -uVar4))) ==
               (long)(lVar16 - (ulong)(uVar12 < -uVar4)) < 0;
    }
    if (!bVar35) goto LAB_0011c5f2;
    lVar9 = (long)psVar21->v + (ulong)CARRY8(uVar20,uVar11) + lVar10;
    psVar5 = (secp256k1_modinv64_signed62 *)((long)psVar5->v + (ulong)CARRY8(uVar12,uVar4) + lVar15)
    ;
    uVar8 = lVar9 * 4 | uVar20 + uVar11 >> 0x3e;
    uVar27 = uStack_318 * iStack_2c8 + uVar8;
    psVar21 = (secp256k1_modinv64_signed62 *)
              ((lVar9 >> 0x3e) + SUB168(SEXT816((long)uStack_318) * SEXT816(iStack_2c8),8) +
              (ulong)CARRY8(uStack_318 * iStack_2c8,uVar8));
    uVar7 = (long)psStack_310 * (long)psStack_2d8;
    lVar10 = SUB168(SEXT816((long)psStack_310) * SEXT816((long)psStack_2d8),8);
    uVar8 = (ulong)(-uVar7 - 1 < uVar27);
    lVar9 = (0x7fffffffffffffff - lVar10) - (long)psVar21;
    psVar23 = (secp256k1_modinv64_signed62 *)0x0;
    psVar34 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - lVar10) - (ulong)(uVar7 != 0));
    psVar24->v[1] = uVar20 + uVar11 & 0x3fffffffffffffff;
    a_02->v[1] = uVar12 + uVar4 & 0x3fffffffffffffff;
    bVar35 = (SBORROW8(0x7fffffffffffffff - lVar10,(long)psVar21) != SBORROW8(lVar9,uVar8)) ==
             (long)(lVar9 - uVar8) < 0;
    if (lVar10 < 0) {
      bVar35 = (SBORROW8((long)psVar21,(long)psVar34) !=
               SBORROW8((long)psVar21 - (long)psVar34,(ulong)(uVar27 < -uVar7))) ==
               (long)(((long)psVar21 - (long)psVar34) - (ulong)(uVar27 < -uVar7)) < 0;
    }
    psVar14 = psStack_2d8;
    if (!bVar35) goto LAB_0011c5f7;
    uVar8 = uVar12 + uVar4 >> 0x3e | (long)psVar5 * 4;
    uVar11 = uStack_328 * iStack_2c8 + uVar8;
    lVar15 = SUB168(SEXT816((long)uStack_328) * SEXT816(iStack_2c8),8) + ((long)psVar5 >> 0x3e) +
             (ulong)CARRY8(uStack_328 * iStack_2c8,uVar8);
    uVar4 = (long)psStack_320 * (long)psStack_2d8;
    lVar16 = SUB168(SEXT816((long)psStack_320) * SEXT816((long)psStack_2d8),8);
    psVar14 = (secp256k1_modinv64_signed62 *)0x7fffffffffffffff;
    uVar8 = (ulong)(-uVar4 - 1 < uVar11);
    lVar9 = (0x7fffffffffffffff - lVar16) - lVar15;
    psVar5 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - lVar16) - (ulong)(uVar4 != 0));
    bVar35 = (SBORROW8(lVar15,(long)psVar5) !=
             SBORROW8(lVar15 - (long)psVar5,(ulong)(uVar11 < -uVar4))) ==
             (long)((lVar15 - (long)psVar5) - (ulong)(uVar11 < -uVar4)) < 0;
    psVar34 = (secp256k1_modinv64_signed62 *)(ulong)bVar35;
    bVar2 = (SBORROW8(0x7fffffffffffffff - lVar16,lVar15) != SBORROW8(lVar9,uVar8)) ==
            (long)(lVar9 - uVar8) < 0;
    if (lVar16 < 0) {
      bVar2 = bVar35;
    }
    if (!bVar2) goto LAB_0011c5fc;
    lVar9 = (long)psVar21->v + (ulong)CARRY8(uVar27,uVar7) + lVar10;
    lVar16 = lVar15 + lVar16 + (ulong)CARRY8(uVar11,uVar4);
    uVar8 = lVar9 * 4 | uVar27 + uVar7 >> 0x3e;
    uVar20 = uStack_318 * (long)psStack_2f8 + uVar8;
    psVar21 = (secp256k1_modinv64_signed62 *)
              ((lVar9 >> 0x3e) + SUB168(SEXT816((long)uStack_318) * SEXT816((long)psStack_2f8),8) +
              (ulong)CARRY8(uStack_318 * (long)psStack_2f8,uVar8));
    uVar12 = (long)psStack_310 * iStack_2f0;
    lVar10 = SUB168(SEXT816((long)psStack_310) * SEXT816(iStack_2f0),8);
    uVar8 = (ulong)(-uVar12 - 1 < uVar20);
    lVar9 = (0x7fffffffffffffff - lVar10) - (long)psVar21;
    bVar35 = (SBORROW8(0x7fffffffffffffff - lVar10,(long)psVar21) != SBORROW8(lVar9,uVar8)) ==
             (long)(lVar9 - uVar8) < 0;
    psVar34 = (secp256k1_modinv64_signed62 *)CONCAT71((int7)(-uVar12 - 1 >> 8),bVar35);
    lVar15 = (-0x8000000000000000 - lVar10) - (ulong)(uVar12 != 0);
    lVar9 = (long)psVar21 - lVar15;
    psVar24->v[2] = uVar27 + uVar7 & 0x3fffffffffffffff;
    a_02->v[2] = uVar11 + uVar4 & 0x3fffffffffffffff;
    if (lVar10 < 0) {
      bVar35 = (SBORROW8((long)psVar21,lVar15) != SBORROW8(lVar9,(ulong)(uVar20 < -uVar12))) ==
               (long)(lVar9 - (ulong)(uVar20 < -uVar12)) < 0;
    }
    psVar23 = psStack_2f8;
    psVar5 = psVar24;
    if (!bVar35) goto LAB_0011c601;
    uVar8 = uVar11 + uVar4 >> 0x3e | lVar16 * 4;
    uVar11 = uVar20 + uVar12;
    psVar21 = (secp256k1_modinv64_signed62 *)
              ((long)psVar21->v + (ulong)CARRY8(uVar20,uVar12) + lVar10);
    uVar12 = uStack_328 * (long)psStack_2f8 + uVar8;
    lVar16 = SUB168(SEXT816((long)uStack_328) * SEXT816((long)psStack_2f8),8) + (lVar16 >> 0x3e) +
             (ulong)CARRY8(uStack_328 * (long)psStack_2f8,uVar8);
    uVar4 = (long)psStack_320 * iStack_2f0;
    lVar10 = SUB168(SEXT816((long)psStack_320) * SEXT816(iStack_2f0),8);
    uVar8 = (ulong)(-uVar4 - 1 < uVar12);
    lVar9 = (0x7fffffffffffffff - lVar10) - lVar16;
    iVar19 = 0;
    alen = 0;
    psVar5 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - lVar10) - (ulong)(uVar4 != 0));
    bVar35 = (SBORROW8(lVar16,(long)psVar5) !=
             SBORROW8(lVar16 - (long)psVar5,(ulong)(uVar12 < -uVar4))) ==
             (long)((lVar16 - (long)psVar5) - (ulong)(uVar12 < -uVar4)) < 0;
    psVar34 = (secp256k1_modinv64_signed62 *)(ulong)bVar35;
    bVar2 = (SBORROW8(0x7fffffffffffffff - lVar10,lVar16) != SBORROW8(lVar9,uVar8)) ==
            (long)(lVar9 - uVar8) < 0;
    if (lVar10 < 0) {
      bVar2 = bVar35;
    }
    iVar3 = 0;
    if (!bVar2) goto LAB_0011c606;
    uVar20 = uVar12 + uVar4;
    lVar10 = lVar16 + lVar10 + (ulong)CARRY8(uVar12,uVar4);
    uVar7 = ((long)psStack_2e0 >> 0x3f) << 8 | (ulong)psStack_2e0 >> 0x38;
    uVar12 = (long)psStack_2e0 * 0x100;
    uVar8 = (ulong)((long)psStack_2e0 * -0x100 - 1U < uVar11);
    lVar9 = (0x7fffffffffffffff - uVar7) - (long)psVar21;
    psVar5 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - uVar7) - (ulong)(uVar12 != 0));
    uVar4 = (ulong)(uVar11 < (ulong)((long)psStack_2e0 * -0x100));
    bVar35 = (SBORROW8((long)psVar21,(long)psVar5) != SBORROW8((long)psVar21 - (long)psVar5,uVar4))
             == (long)(((long)psVar21 - (long)psVar5) - uVar4) < 0;
    psVar34 = (secp256k1_modinv64_signed62 *)(ulong)bVar35;
    bVar2 = (SBORROW8(0x7fffffffffffffff - uVar7,(long)psVar21) != SBORROW8(lVar9,uVar8)) ==
            (long)(lVar9 - uVar8) < 0;
    if ((long)psStack_2e0 < 0) {
      bVar2 = bVar35;
    }
    if (!bVar2) goto LAB_0011c60b;
    uVar31 = (long)psVar22 << 8 | (ulong)psVar32 >> 0x38;
    uVar27 = (long)psVar32 * 0x100;
    uVar8 = (ulong)((long)psVar32 * -0x100 - 1U < uVar20);
    lVar9 = (0x7fffffffffffffff - uVar31) - lVar10;
    psVar5 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - uVar31) - (ulong)(uVar27 != 0));
    uVar4 = (ulong)(uVar20 < (ulong)((long)psVar32 * -0x100));
    psVar14 = (secp256k1_modinv64_signed62 *)((lVar10 - (long)psVar5) - uVar4);
    bVar35 = (long)psVar32 < 0;
    psVar32 = (secp256k1_modinv64_signed62 *)
              (ulong)((SBORROW8(lVar10,(long)psVar5) != SBORROW8(lVar10 - (long)psVar5,uVar4)) ==
                     (long)psVar14 < 0);
    psVar34 = (secp256k1_modinv64_signed62 *)
              (ulong)((SBORROW8(0x7fffffffffffffff - uVar31,lVar10) != SBORROW8(lVar9,uVar8)) ==
                     (long)(lVar9 - uVar8) < 0);
    if (bVar35) {
      psVar34 = psVar32;
    }
    iVar19 = 0;
    if ((char)psVar34 == '\0') goto LAB_0011c610;
    lVar9 = (long)psVar21->v + CARRY8(uVar11,uVar12) + uVar7;
    lVar10 = lVar10 + uVar31 + (ulong)CARRY8(uVar20,uVar27);
    uVar8 = lVar9 * 4 | uVar11 + uVar12 >> 0x3e;
    psVar24->v[3] = uVar11 + uVar12 & 0x3fffffffffffffff;
    a_02->v[3] = uVar20 + uVar27 & 0x3fffffffffffffff;
    psVar32 = (secp256k1_modinv64_signed62 *)(uVar8 + 0x8000000000000000);
    psVar21 = (secp256k1_modinv64_signed62 *)
              ((lVar9 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar8));
    if (psVar21 != (secp256k1_modinv64_signed62 *)0xffffffffffffffff) goto LAB_0011c615;
    psVar32 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    uVar4 = uVar20 + uVar27 >> 0x3e | lVar10 * 4;
    psVar24->v[4] = uVar8;
    alen = (int)uVar4;
    if ((lVar10 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar4) != -1) goto LAB_0011c61a;
    a_02->v[4] = uVar4;
    alen = 5;
    psVar32 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c528;
    psVar21 = psVar24;
    iVar3 = secp256k1_modinv64_mul_cmp_62(psVar24,5,&secp256k1_const_modinfo_fe.modulus,-2);
    if (iVar3 < 1) goto LAB_0011c61f;
    psVar32 = (secp256k1_modinv64_signed62 *)0x1;
    alen = 5;
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c549;
    psVar21 = psVar24;
    iVar3 = secp256k1_modinv64_mul_cmp_62(psVar24,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar3) goto LAB_0011c624;
    alen = 5;
    psVar32 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c56c;
    psVar21 = a_02;
    iVar3 = secp256k1_modinv64_mul_cmp_62(a_02,5,&secp256k1_const_modinfo_fe.modulus,-2);
    if (iVar3 < 1) goto LAB_0011c629;
    psVar32 = (secp256k1_modinv64_signed62 *)0x1;
    alen = 5;
    psStack_338 = (secp256k1_modinv64_signed62 *)0x11c58d;
    iVar3 = secp256k1_modinv64_mul_cmp_62(a_02,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (iVar3 < 0) {
      return;
    }
  }
  psStack_338 = (secp256k1_modinv64_signed62 *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_17();
  psVar23 = &sStack_398;
  psStack_348 = psVar24;
  psStack_340 = psVar14;
  psStack_338 = psVar5;
  secp256k1_modinv64_mul_62(&sStack_370,a_02,alen,1);
  psVar24 = a_00;
  secp256k1_modinv64_mul_62(&sStack_398,a_00,5,(int64_t)psVar32);
  lVar9 = 0;
  while ((ulong)sStack_370.v[lVar9] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_398.v[lVar9]) goto LAB_0011c6c3;
    lVar9 = lVar9 + 1;
    if (lVar9 == 4) {
      uVar17 = 4;
      while( true ) {
        if (sStack_370.v[uVar17] < sStack_398.v[uVar17]) {
          return;
        }
        if (sStack_398.v[uVar17] < sStack_370.v[uVar17]) break;
        bVar35 = uVar17 == 0;
        uVar17 = uVar17 - 1;
        if (bVar35) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_0011c6c3:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  lVar9 = psVar23->v[0];
  uVar8 = psVar23->v[1];
  uVar4 = psVar23->v[2];
  uVar11 = psVar23->v[3];
  lVar10 = psVar23->v[4];
  lVar16 = 0;
  do {
    if (psVar23->v[lVar16] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_0011c8ed:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_0011c8f2;
    }
    if (0x3fffffffffffffff < psVar23->v[lVar16]) goto LAB_0011c8ed;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 5);
  iVar3 = secp256k1_modinv64_mul_cmp_62(psVar23,5,&secp256k1_const_modinfo_fe.modulus,-2);
  if (iVar3 < 1) {
LAB_0011c8f2:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_0011c8f7:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_0011c8fc:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar3 = secp256k1_modinv64_mul_cmp_62(psVar23,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar3) goto LAB_0011c8f7;
    uVar12 = lVar10 >> 0x3f;
    uVar33 = (long)psVar24 >> 0x3f;
    uVar20 = (lVar9 + (uVar12 & 0xfffffffefffffc2f) ^ uVar33) - uVar33;
    uVar7 = ((long)uVar20 >> 0x3e) + ((uVar8 ^ uVar33) - uVar33);
    uVar27 = ((long)uVar7 >> 0x3e) + ((uVar4 ^ uVar33) - uVar33);
    uVar31 = ((long)uVar27 >> 0x3e) + ((uVar11 ^ uVar33) - uVar33);
    lVar9 = ((long)uVar31 >> 0x3e) + (((uVar12 & 0x100) + lVar10 ^ uVar33) - uVar33);
    uVar11 = lVar9 >> 0x3f;
    uVar8 = (uVar11 & 0xfffffffefffffc2f) + (uVar20 & 0x3fffffffffffffff);
    uVar4 = ((long)uVar8 >> 0x3e) + (uVar7 & 0x3fffffffffffffff);
    uVar12 = ((long)uVar4 >> 0x3e) + (uVar27 & 0x3fffffffffffffff);
    uVar20 = ((long)uVar12 >> 0x3e) + (uVar31 & 0x3fffffffffffffff);
    uVar11 = ((long)uVar20 >> 0x3e) + (uVar11 & 0x100) + lVar9;
    psVar23->v[0] = uVar8 & 0x3fffffffffffffff;
    psVar23->v[1] = uVar4 & 0x3fffffffffffffff;
    psVar23->v[2] = uVar12 & 0x3fffffffffffffff;
    psVar23->v[3] = uVar20 & 0x3fffffffffffffff;
    psVar23->v[4] = uVar11;
    if (0x3fffffffffffffff < uVar11) goto LAB_0011c8fc;
    iVar3 = secp256k1_modinv64_mul_cmp_62(psVar23,5,&secp256k1_const_modinfo_fe.modulus,0);
    if (-1 < iVar3) {
      iVar3 = secp256k1_modinv64_mul_cmp_62(psVar23,5,&secp256k1_const_modinfo_fe.modulus,1);
      if (iVar3 < 0) {
        return;
      }
      goto LAB_0011c906;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_0011c906:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_cmov(secp256k1_fe *r, const secp256k1_fe *a, int flag) {
    VERIFY_CHECK(flag == 0 || flag == 1);
    SECP256K1_FE_VERIFY(a);
    SECP256K1_FE_VERIFY(r);

    secp256k1_fe_impl_cmov(r, a, flag);
    if (a->magnitude > r->magnitude) r->magnitude = a->magnitude;
    if (!a->normalized) r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}